

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

void __thiscall docopt::LeafPattern::~LeafPattern(LeafPattern *this)

{
  Kind KVar1;
  pointer pbVar2;
  pointer pcVar3;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR_flat_001b9348;
  KVar1 = (this->fValue).kind;
  if (KVar1 == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->fValue).variant.strList);
  }
  else if ((KVar1 == String) &&
          (pbVar2 = (this->fValue).variant.strList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pbVar2 != (pointer)((long)&(this->fValue).variant + 0x10))) {
    operator_delete(pbVar2);
  }
  pcVar3 = (this->fName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->fName).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

LeafPattern(std::string name, value v = {})
		: fName(std::move(name)),
		  fValue(std::move(v))
		{}